

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void * op_url_stream_vcreate_impl
                 (OpusFileCallbacks *_cb,char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,
                 __va_list_tag *_ap)

{
  long lVar1;
  void *pvVar2;
  char *_proxy_host;
  uint _skip_certificate_check;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  uint *puVar7;
  undefined8 *puVar8;
  char *_proxy_user;
  uint _proxy_port;
  uint uVar9;
  OpusServerInfo *pOVar10;
  char *local_38;
  
  *_pinfo = (OpusServerInfo *)0x0;
  uVar9 = _ap->gp_offset;
  _proxy_port = 0x1f90;
  _proxy_host = (char *)0x0;
  _proxy_user = (char *)0x0;
  local_38 = (char *)0x0;
  pOVar10 = (OpusServerInfo *)0x0;
  _skip_certificate_check = 0;
  while( true ) {
    if (uVar9 < 0x29) {
      plVar3 = (long *)((ulong)uVar9 + (long)_ap->reg_save_area);
      uVar9 = uVar9 + 8;
      _ap->gp_offset = uVar9;
    }
    else {
      plVar3 = (long *)_ap->overflow_arg_area;
      _ap->overflow_arg_area = plVar3 + 1;
    }
    lVar1 = *plVar3;
    if (lVar1 == 0) break;
    uVar4 = lVar1 << 0x3a | lVar1 - 0x1940U >> 6;
    if (5 < uVar4) {
      return (void *)0x0;
    }
    uVar5 = (ulong)uVar9;
    switch(uVar4) {
    case 0:
      if (uVar9 < 0x29) {
        piVar6 = (int *)(uVar5 + (long)_ap->reg_save_area);
        uVar9 = uVar9 + 8;
        _ap->gp_offset = uVar9;
      }
      else {
        piVar6 = (int *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = piVar6 + 2;
      }
      _skip_certificate_check = (uint)(*piVar6 != 0);
      break;
    case 1:
      if (uVar9 < 0x29) {
        puVar8 = (undefined8 *)(uVar5 + (long)_ap->reg_save_area);
        uVar9 = uVar9 + 8;
        _ap->gp_offset = uVar9;
      }
      else {
        puVar8 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar8 + 1;
      }
      _proxy_host = (char *)*puVar8;
      break;
    case 2:
      if (uVar9 < 0x29) {
        puVar7 = (uint *)(uVar5 + (long)_ap->reg_save_area);
        uVar9 = uVar9 + 8;
        _ap->gp_offset = uVar9;
      }
      else {
        puVar7 = (uint *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar7 + 2;
      }
      _proxy_port = *puVar7;
      if (0xffff < _proxy_port) {
        return (void *)0x0;
      }
      break;
    case 3:
      if (uVar9 < 0x29) {
        puVar8 = (undefined8 *)(uVar5 + (long)_ap->reg_save_area);
        uVar9 = uVar9 + 8;
        _ap->gp_offset = uVar9;
      }
      else {
        puVar8 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar8 + 1;
      }
      _proxy_user = (char *)*puVar8;
      break;
    case 4:
      if (uVar9 < 0x29) {
        puVar8 = (undefined8 *)(uVar5 + (long)_ap->reg_save_area);
        uVar9 = uVar9 + 8;
        _ap->gp_offset = uVar9;
      }
      else {
        puVar8 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar8 + 1;
      }
      local_38 = (char *)*puVar8;
      break;
    case 5:
      if (uVar9 < 0x29) {
        puVar8 = (undefined8 *)(uVar5 + (long)_ap->reg_save_area);
        uVar9 = uVar9 + 8;
        _ap->gp_offset = uVar9;
      }
      else {
        puVar8 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar8 + 1;
      }
      pOVar10 = (OpusServerInfo *)*puVar8;
    }
  }
  if (pOVar10 == (OpusServerInfo *)0x0) {
    pvVar2 = op_url_stream_create_impl
                       (_cb,_url,_skip_certificate_check,_proxy_host,_proxy_port,_proxy_user,
                        local_38,(OpusServerInfo *)0x0);
    return pvVar2;
  }
  _info->server = (char *)0x0;
  _info->content_type = (char *)0x0;
  _info->genre = (char *)0x0;
  _info->url = (char *)0x0;
  _info->name = (char *)0x0;
  _info->description = (char *)0x0;
  _info->bitrate_kbps = -1;
  _info->is_public = -1;
  _info->is_ssl = 0;
  pvVar2 = op_url_stream_create_impl
                     (_cb,_url,_skip_certificate_check,_proxy_host,_proxy_port,_proxy_user,local_38,
                      _info);
  if (pvVar2 == (void *)0x0) {
    opus_server_info_clear(_info);
    return (void *)0x0;
  }
  *_pinfo = pOVar10;
  return pvVar2;
}

Assistant:

static void *op_url_stream_vcreate_impl(OpusFileCallbacks *_cb,
 const char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,va_list _ap){
  int             skip_certificate_check;
  const char     *proxy_host;
  opus_int32      proxy_port;
  const char     *proxy_user;
  const char     *proxy_pass;
  OpusServerInfo *pinfo;
  skip_certificate_check=0;
  proxy_host=NULL;
  proxy_port=8080;
  proxy_user=NULL;
  proxy_pass=NULL;
  pinfo=NULL;
  *_pinfo=NULL;
  for(;;){
    ptrdiff_t request;
    request=va_arg(_ap,char *)-(char *)NULL;
    /*If we hit NULL, we're done processing options.*/
    if(!request)break;
    switch(request){
      case OP_SSL_SKIP_CERTIFICATE_CHECK_REQUEST:{
        skip_certificate_check=!!va_arg(_ap,opus_int32);
      }break;
      case OP_HTTP_PROXY_HOST_REQUEST:{
        proxy_host=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PORT_REQUEST:{
        proxy_port=va_arg(_ap,opus_int32);
        if(proxy_port<0||proxy_port>(opus_int32)65535)return NULL;
      }break;
      case OP_HTTP_PROXY_USER_REQUEST:{
        proxy_user=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PASS_REQUEST:{
        proxy_pass=va_arg(_ap,const char *);
      }break;
      case OP_GET_SERVER_INFO_REQUEST:{
        pinfo=va_arg(_ap,OpusServerInfo *);
      }break;
      /*Some unknown option.*/
      default:return NULL;
    }
  }
  /*If the caller has requested server information, proxy it to a local copy to
     simplify error handling.*/
  if(pinfo!=NULL){
    void *ret;
    opus_server_info_init(_info);
    ret=op_url_stream_create_impl(_cb,_url,skip_certificate_check,
     proxy_host,proxy_port,proxy_user,proxy_pass,_info);
    if(ret!=NULL)*_pinfo=pinfo;
    else opus_server_info_clear(_info);
    return ret;
  }
  return op_url_stream_create_impl(_cb,_url,skip_certificate_check,
   proxy_host,proxy_port,proxy_user,proxy_pass,NULL);
}